

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void write_u8_tick(Emulator *e,Address addr,u8 value)

{
  Ticks *pTVar1;
  MemoryTypeAddressPair pair;
  
  (e->state).interrupt.if_ = (e->state).interrupt.new_if;
  pTVar1 = &(e->state).ticks;
  *pTVar1 = *pTVar1 + (e->state).cpu_tick;
  dma_synchronize(e);
  if (((addr & 0xff00) == 0xfe00) && ((e->state).dma.state == DMA_ACTIVE)) {
    return;
  }
  pair = map_address(addr);
  write_u8_pair(e,pair,value);
  return;
}

Assistant:

static void write_u8_tick(Emulator* e, Address addr, u8 value) {
  tick(e);
  write_u8(e, addr, value);
}